

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O1

void __thiscall
asio::ssl::detail::
io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>
::operator()(io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>
             *this,error_code ec,size_t bytes_transferred,int start)

{
  stream_core *psVar1;
  ulong uVar2;
  stream_core *psVar3;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *pbVar4;
  service_type *psVar5;
  steady_timer *psVar6;
  want wVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  error_category *peVar12;
  non_const_lvalue<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::write_op<asio::const_buffers_1>,_asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>_>_>
  handler2;
  implementation_type *impl;
  service_type *this_00;
  error_code ec_00;
  transfer_all_t local_59;
  undefined8 local_58;
  error_category *peStack_50;
  int local_44;
  error_category *local_40;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *local_38;
  
  local_40 = ec._M_cat;
  local_44 = ec._M_value;
  this->start_ = start;
  if (start != 1) goto LAB_001a2b63;
  do {
    wVar7 = write_op<asio::const_buffers_1>::operator()
                      (&this->op_,&this->core_->engine_,&this->ec_,&this->bytes_transferred_);
    this->want_ = wVar7;
    if (wVar7 == want_input_and_retry) {
      psVar1 = this->core_;
      sVar11 = (psVar1->input_).size_;
      if (sVar11 == 0) {
        impl = &(psVar1->pending_read_).impl_.implementation_;
        if ((psVar1->pending_read_).impl_.implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
          peStack_50 = (error_category *)std::_V2::system_category();
          asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel((psVar1->pending_read_).impl_.service_,impl,(error_code *)&local_58);
          (psVar1->pending_read_).impl_.implementation_.expiry.__d.__r = 0x7fffffffffffffff;
          pbVar4 = this->next_layer_;
          local_58 = (this->core_->input_buffer_).data_;
          peStack_50 = (error_category *)(this->core_->input_buffer_).size_;
          psVar5 = (pbVar4->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.service_
          ;
          goto LAB_001a2f5f;
        }
        this_00 = (psVar1->pending_read_).impl_.service_;
        psVar6 = &psVar1->pending_read_;
        goto LAB_001a2f7c;
      }
      uVar8 = BIO_write((BIO *)(psVar1->engine_).ext_bio_,(psVar1->input_).data_,(int)sVar11);
      uVar10 = 0;
      if (0 < (int)uVar8) {
        uVar10 = (ulong)uVar8;
      }
      uVar2 = (psVar1->input_).size_;
      if (uVar2 < uVar10) {
        uVar10 = uVar2;
      }
      psVar3 = this->core_;
      (psVar3->input_).data_ = (void *)(uVar10 + (long)(psVar1->input_).data_);
      (psVar3->input_).size_ = uVar2 - uVar10;
    }
    else {
      if ((wVar7 == want_output_and_retry) || (wVar7 == want_output)) {
        psVar1 = this->core_;
        impl = &(psVar1->pending_write_).impl_.implementation_;
        if ((psVar1->pending_write_).impl_.implementation_.expiry.__d.__r == -0x8000000000000000) {
          local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
          peStack_50 = (error_category *)std::_V2::system_category();
          asio::detail::
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          ::cancel((psVar1->pending_write_).impl_.service_,impl,(error_code *)&local_58);
          (psVar1->pending_write_).impl_.implementation_.expiry.__d.__r = 0x7fffffffffffffff;
          pbVar4 = this->next_layer_;
          psVar1 = this->core_;
          uVar8 = BIO_read((BIO *)(psVar1->engine_).ext_bio_,(psVar1->output_buffer_).data_,
                           (int)(psVar1->output_buffer_).size_);
          peStack_50 = (error_category *)0x0;
          if (0 < (int)uVar8) {
            peStack_50 = (error_category *)(ulong)uVar8;
          }
          local_58 = (psVar1->output_buffer_).data_;
          peVar12 = (error_category *)(psVar1->output_buffer_).size_;
          if (peVar12 < peStack_50) {
            peStack_50 = peVar12;
          }
          local_38 = pbVar4;
          asio::detail::
          initiate_async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>::
          operator()((initiate_async_write<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>
                      *)&local_38,this,(mutable_buffer *)&local_58,&local_59);
          return;
        }
        this_00 = (psVar1->pending_write_).impl_.service_;
        psVar6 = &psVar1->pending_write_;
LAB_001a2f7c:
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
        ::
        async_wait<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::write_op<asio::const_buffers_1>,asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>>,asio::any_io_executor>
                  ((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
                    *)this_00,impl,this,&(psVar6->impl_).executor_);
        return;
      }
      if (start != 0) {
        pbVar4 = this->next_layer_;
        local_58 = (this->core_->input_buffer_).data_;
        peStack_50 = (error_category *)0x0;
        psVar5 = (pbVar4->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.service_;
LAB_001a2f5f:
        asio::detail::reactive_socket_service_base::
        async_receive<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::write_op<asio::const_buffers_1>,asio::detail::write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::buffer>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::buffer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::error_code,unsigned_long)>>>,asio::any_io_executor>
                  (&psVar5->super_reactive_socket_service_base,
                   &(pbVar4->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                    implementation_.super_base_implementation_type,(mutable_buffers_1 *)&local_58,0,
                   this,&(pbVar4->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.
                         executor_);
        return;
      }
LAB_001a2b63:
      uVar10 = 0;
      if ((bytes_transferred != 0xffffffffffffffff) &&
         (uVar10 = bytes_transferred, (this->ec_)._M_value == 0)) {
        (this->ec_)._M_value = local_44;
        (this->ec_)._M_cat = local_40;
      }
      bytes_transferred = uVar10;
      wVar7 = this->want_;
      if (wVar7 == want_input_and_retry) {
        psVar1 = this->core_;
        uVar10 = (psVar1->input_buffer_).size_;
        if (bytes_transferred <= uVar10) {
          uVar10 = bytes_transferred;
        }
        (psVar1->input_).data_ = (psVar1->input_buffer_).data_;
        (psVar1->input_).size_ = uVar10;
        psVar1 = this->core_;
        uVar8 = BIO_write((BIO *)(psVar1->engine_).ext_bio_,(psVar1->input_).data_,
                          (int)(psVar1->input_).size_);
        uVar10 = 0;
        if (0 < (int)uVar8) {
          uVar10 = (ulong)uVar8;
        }
        uVar2 = (psVar1->input_).size_;
        if (uVar2 < uVar10) {
          uVar10 = uVar2;
        }
        psVar3 = this->core_;
        (psVar3->input_).data_ = (void *)(uVar10 + (long)(psVar1->input_).data_);
        (psVar3->input_).size_ = uVar2 - uVar10;
        psVar1 = this->core_;
        local_58 = (void *)((ulong)local_58 & 0xffffffff00000000);
        peStack_50 = (error_category *)std::_V2::system_category();
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::cancel((psVar1->pending_read_).impl_.service_,
                 &(psVar1->pending_read_).impl_.implementation_,(error_code *)&local_58);
        (psVar1->pending_read_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
      }
      else {
        if (wVar7 != want_output_and_retry) {
          if (wVar7 == want_output) {
            psVar1 = this->core_;
            local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
            peStack_50 = (error_category *)std::_V2::system_category();
            asio::detail::
            deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::cancel((psVar1->pending_write_).impl_.service_,
                     &(psVar1->pending_write_).impl_.implementation_,(error_code *)&local_58);
            (psVar1->pending_write_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
          }
          psVar1 = this->core_;
          std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_58,eof);
          if ((((this->ec_)._M_cat == peStack_50) && ((this->ec_)._M_value == (int)local_58)) &&
             ((lVar9 = BIO_ctrl((BIO *)(psVar1->engine_).ext_bio_,0xd,0,(void *)0x0),
              (int)lVar9 != 0 ||
              (uVar8 = SSL_get_shutdown((SSL *)(psVar1->engine_).ssl_), (uVar8 & 2) == 0)))) {
            std::error_code::operator=(&this->ec_,stream_truncated);
          }
          uVar8 = (this->ec_)._M_value;
          sVar11 = 0;
          if (uVar8 == 0) {
            sVar11 = this->bytes_transferred_;
          }
          peVar12 = (this->ec_)._M_cat;
          goto LAB_001a2ea8;
        }
        psVar1 = this->core_;
        local_58 = (void *)((ulong)local_58._4_4_ << 0x20);
        peStack_50 = (error_category *)std::_V2::system_category();
        asio::detail::
        deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
        ::cancel((psVar1->pending_write_).impl_.service_,
                 &(psVar1->pending_write_).impl_.implementation_,(error_code *)&local_58);
        (psVar1->pending_write_).impl_.implementation_.expiry.__d.__r = -0x8000000000000000;
      }
    }
  } while ((this->ec_)._M_value == 0);
  psVar1 = this->core_;
  std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_58,eof);
  if ((((this->ec_)._M_cat == peStack_50) && ((this->ec_)._M_value == (int)local_58)) &&
     ((lVar9 = BIO_ctrl((BIO *)(psVar1->engine_).ext_bio_,0xd,0,(void *)0x0), (int)lVar9 != 0 ||
      (uVar8 = SSL_get_shutdown((SSL *)(psVar1->engine_).ssl_), (uVar8 & 2) == 0)))) {
    std::error_code::operator=(&this->ec_,stream_truncated);
  }
  uVar8 = (this->ec_)._M_value;
  peVar12 = (this->ec_)._M_cat;
  sVar11 = 0;
LAB_001a2ea8:
  ec_00._4_4_ = 0;
  ec_00._M_value = uVar8;
  ec_00._M_cat = peVar12;
  asio::detail::
  write_op<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::buffer>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::buffer>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::error_code,_unsigned_long)>_>
  ::operator()(&this->handler_,ec_00,sVar11,0);
  return;
}

Assistant:

void operator()(asio::error_code ec,
      std::size_t bytes_transferred = ~std::size_t(0), int start = 0)
  {
    switch (start_ = start)
    {
    case 1: // Called after at least one async operation.
      do
      {
        switch (want_ = op_(core_.engine_, ec_, bytes_transferred_))
        {
        case engine::want_input_and_retry:

          // If the input buffer already has data in it we can pass it to the
          // engine and then retry the operation immediately.
          if (core_.input_.size() != 0)
          {
            core_.input_ = core_.engine_.put_input(core_.input_);
            continue;
          }

          // The engine wants more data to be read from input. However, we
          // cannot allow more than one read operation at a time on the
          // underlying transport. The pending_read_ timer's expiry is set to
          // pos_infin if a read is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_read_) == core_.neg_infin())
          {
            // Prevent other read operations from being started.
            core_.pending_read_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start reading some data from the underlying transport.
            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current read operation completes.
            core_.pending_read_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        case engine::want_output_and_retry:
        case engine::want_output:

          // The engine wants some data to be written to the output. However, we
          // cannot allow more than one write operation at a time on the
          // underlying transport. The pending_write_ timer's expiry is set to
          // pos_infin if a write is in progress, and neg_infin otherwise.
          if (core_.expiry(core_.pending_write_) == core_.neg_infin())
          {
            // Prevent other write operations from being started.
            core_.pending_write_.expires_at(core_.pos_infin());

            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Start writing all the data to the underlying transport.
            asio::async_write(next_layer_,
                core_.engine_.get_output(core_.output_buffer_),
                ASIO_MOVE_CAST(io_op)(*this));
          }
          else
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            // Wait until the current write operation completes.
            core_.pending_write_.async_wait(ASIO_MOVE_CAST(io_op)(*this));
          }

          // Yield control until asynchronous operation completes. Control
          // resumes at the "default:" label below.
          return;

        default:

          // The SSL operation is done and we can invoke the handler, but we
          // have to keep in mind that this function might be being called from
          // the async operation's initiating function. In this case we're not
          // allowed to call the handler directly. Instead, issue a zero-sized
          // read so the handler runs "as-if" posted using io_context::post().
          if (start)
          {
            ASIO_HANDLER_LOCATION((
                  __FILE__, __LINE__, Operation::tracking_name()));

            next_layer_.async_read_some(
                asio::buffer(core_.input_buffer_, 0),
                ASIO_MOVE_CAST(io_op)(*this));

            // Yield control until asynchronous operation completes. Control
            // resumes at the "default:" label below.
            return;
          }
          else
          {
            // Continue on to run handler directly.
            break;
          }
        }

        default:
        if (bytes_transferred == ~std::size_t(0))
          bytes_transferred = 0; // Timer cancellation, no data transferred.
        else if (!ec_)
          ec_ = ec;

        switch (want_)
        {
        case engine::want_input_and_retry:

          // Add received data to the engine's input.
          core_.input_ = asio::buffer(
              core_.input_buffer_, bytes_transferred);
          core_.input_ = core_.engine_.put_input(core_.input_);

          // Release any waiting read operations.
          core_.pending_read_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output_and_retry:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Check for cancellation before continuing.
          if (this->cancelled() != cancellation_type::none)
          {
            ec_ = asio::error::operation_aborted;
            break;
          }

          // Try the operation again.
          continue;

        case engine::want_output:

          // Release any waiting write operations.
          core_.pending_write_.expires_at(core_.neg_infin());

          // Fall through to call handler.

        default:

          // Pass the result to the handler.
          op_.call_handler(handler_,
              core_.engine_.map_error_code(ec_),
              ec_ ? 0 : bytes_transferred_);

          // Our work here is done.
          return;
        }
      } while (!ec_);

      // Operation failed. Pass the result to the handler.
      op_.call_handler(handler_, core_.engine_.map_error_code(ec_), 0);
    }
  }